

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_future.cpp
# Opt level: O2

void __thiscall
Omega_h::Future<signed_char>::Future(Future<signed_char> *this,Read<signed_char> *buf)

{
  Write<signed_char> local_78;
  Write<signed_char> local_68;
  anon_class_16_1_ba1d39d3 local_58;
  _Vector_base<int,_std::allocator<int>_> local_48;
  callback_type local_28;
  
  local_68.shared_alloc_.alloc = (Alloc *)0x0;
  local_68.shared_alloc_.direct_ptr = (void *)0x0;
  local_78.shared_alloc_.alloc = (Alloc *)0x0;
  local_78.shared_alloc_.direct_ptr = (void *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Write<signed_char>::Write((Write<signed_char> *)&local_58,&buf->write_);
  std::function<Omega_h::Read<signed_char>(Omega_h::Write<signed_char>)>::
  function<Omega_h::Future<signed_char>::Future(Omega_h::Read<signed_char>)::_lambda(Omega_h::Write<signed_char>)_1_,void>
            ((function<Omega_h::Read<signed_char>(Omega_h::Write<signed_char>)> *)&local_28,
             &local_58);
  Future(this,(Read<signed_char> *)&local_68,&local_78,(requests_type *)&local_48,&local_28);
  std::_Function_base::~_Function_base(&local_28.super__Function_base);
  Write<signed_char>::~Write((Write<signed_char> *)&local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  Write<signed_char>::~Write(&local_78);
  Write<signed_char>::~Write(&local_68);
  this->status_ = completed;
  return;
}

Assistant:

Future<T>::Future(Read<T> buf)
    : Future({} /* sendbuf */, {} /* recvbuf */, {} /* request */,
          [buf](recvbuf_type) { return buf; }) {
  status_ = Status::completed;
}